

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::ReserveKeyFromKeyPool
          (LegacyScriptPubKeyMan *this,int64_t *nIndex,CKeyPool *keypool,bool fRequestedInternal)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  reference plVar4;
  iterator wallet_fmt;
  runtime_error *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  key_type_conflict4 *__k;
  mapped_type *pmVar6;
  byte in_CL;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  set<long,_std::less<long>,_std::allocator<long>_> *setKeyPool;
  bool use_split_keypool;
  bool fReturningInternal;
  iterator it;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  CPubKey pk;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  WalletBatch *in_stack_fffffffffffffcf8;
  map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_> *this_01;
  const_iterator in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  CKeyPool *in_stack_fffffffffffffd10;
  WalletBatch *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  allocator<char> *in_stack_fffffffffffffd28;
  long *in_stack_fffffffffffffd30;
  char *__s;
  ScriptPubKeyMan *in_stack_fffffffffffffd38;
  byte local_272;
  byte local_205;
  char local_203 [3];
  _Base_ptr local_200;
  _Base_ptr local_1f8;
  undefined8 local_1bc;
  undefined8 uStack_1b4;
  undefined4 local_1ac;
  string local_188 [64];
  string local_148 [64];
  string local_108 [35];
  undefined1 local_e5 [20];
  undefined1 local_d1 [97];
  string local_70 [39];
  undefined8 local_49;
  undefined8 uStack_41;
  undefined8 local_39;
  undefined8 uStack_31;
  undefined8 local_29;
  undefined8 uStack_21;
  undefined8 local_19;
  undefined8 uStack_11;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RSI = -1;
  CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  *(undefined1 *)(in_RDX + 0x48) = local_9;
  *(undefined8 *)(in_RDX + 0x38) = local_19;
  *(undefined8 *)(in_RDX + 0x40) = uStack_11;
  *(undefined8 *)(in_RDX + 0x28) = local_29;
  *(undefined8 *)(in_RDX + 0x30) = uStack_21;
  *(undefined8 *)(in_RDX + 0x18) = local_39;
  *(undefined8 *)(in_RDX + 0x20) = uStack_31;
  *(undefined8 *)(in_RDX + 8) = local_49;
  *(undefined8 *)(in_RDX + 0x10) = uStack_41;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd28,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             (char *)in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
             (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
  bVar1 = (**(code **)(*in_RDI + 0x60))();
  if ((bVar1 & 1) == 0) {
LAB_01667b49:
    local_272 = (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],0x100000000);
  }
  else {
    bVar1 = (**(code **)(*(long *)in_RDI[1] + 0x30))((long *)in_RDI[1],0x2227c);
    local_272 = 1;
    if ((bVar1 & 1) == 0) goto LAB_01667b49;
  }
  bVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::empty
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)
                     CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  bVar3 = std::set<long,_std::less<long>,_std::allocator<long>_>::empty
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)
                     CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  if (bVar3) {
    local_205 = 0;
    bVar2 = true;
  }
  else {
    (**(code **)(*(long *)in_RDI[1] + 0x18))();
    WalletBatch::WalletBatch
              (in_stack_fffffffffffffcf8,
               (WalletDatabase *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               (bool)in_stack_fffffffffffffcef);
    local_1f8 = (_Base_ptr)
                std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                          ((set<long,_std::less<long>,_std::allocator<long>_> *)
                           CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    plVar4 = std::_Rb_tree_const_iterator<long>::operator*
                       ((_Rb_tree_const_iterator<long> *)
                        CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    *in_RSI = *plVar4;
    local_200 = local_1f8;
    wallet_fmt = std::set<long,std::less<long>,std::allocator<long>>::erase_abi_cxx11_
                           ((set<long,_std::less<long>,_std::allocator<long>_> *)
                            CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                            in_stack_fffffffffffffd00);
    bVar3 = WalletBatch::ReadPool
                      (in_stack_fffffffffffffd18,
                       CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                       in_stack_fffffffffffffd10);
    if (!bVar3) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30,
                 in_stack_fffffffffffffd28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd00._M_node,(char *)in_stack_fffffffffffffcf8);
      std::runtime_error::runtime_error(prVar5,local_70);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_01668527;
    }
    CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    CPubKey::GetID((CPubKey *)in_stack_fffffffffffffd10);
    bVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,local_e5,local_d1);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd00._M_node,(char *)in_stack_fffffffffffffcf8);
      std::runtime_error::runtime_error((runtime_error *)this_00,local_108);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_01668527;
    }
    if ((bVar2) && ((bool)(*(byte *)(in_RDX + 0x49) & 1) != ((in_CL & 1 & local_272 & 1) != 0))) {
      __a = (allocator<char> *)__cxa_allocate_exception(0x10);
      __s = local_203;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd38,__s,__a);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd00._M_node,(char *)in_stack_fffffffffffffcf8);
      std::runtime_error::runtime_error((runtime_error *)__a,local_148);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(__a,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_01668527;
    }
    bVar2 = CPubKey::IsValid((CPubKey *)
                             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    if (!bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30,
                 in_stack_fffffffffffffd28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd00._M_node,(char *)in_stack_fffffffffffffcf8);
      std::runtime_error::runtime_error(prVar5,local_188);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_01668527;
    }
    __k = (key_type_conflict4 *)
          std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::
          count((map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
                 *)in_stack_fffffffffffffcf8,
                (key_type_conflict4 *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0))
    ;
    if (__k != (key_type_conflict4 *)0x0) {
      __assert_fail("m_index_to_reserved_key.count(nIndex) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x5cc,
                    "bool wallet::LegacyScriptPubKeyMan::ReserveKeyFromKeyPool(int64_t &, CKeyPool &, bool)"
                   );
    }
    CPubKey::GetID((CPubKey *)in_stack_fffffffffffffd10);
    pmVar6 = std::
             map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::
             operator[]((map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
                         *)in_stack_fffffffffffffd10,__k);
    *(undefined4 *)((pmVar6->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10) =
         local_1ac;
    *(undefined8 *)(pmVar6->super_uint160).super_base_blob<160U>.m_data._M_elems = local_1bc;
    *(undefined8 *)((pmVar6->super_uint160).super_base_blob<160U>.m_data._M_elems + 8) = uStack_1b4;
    this_01 = (map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
               *)(in_RDI + 0x5f);
    CPubKey::GetID((CPubKey *)in_stack_fffffffffffffd10);
    std::map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
    erase(this_01,(key_type *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    ScriptPubKeyMan::WalletLogPrintf<long>
              (in_stack_fffffffffffffd38,(ConstevalFormatString<1U>)wallet_fmt._M_node,
               in_stack_fffffffffffffd30);
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    bVar2 = false;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  if (!bVar2) {
    boost::signals2::
    signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
    ::operator()((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
                  *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    local_205 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_205 & 1);
  }
LAB_01668527:
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ReserveKeyFromKeyPool(int64_t& nIndex, CKeyPool& keypool, bool fRequestedInternal)
{
    nIndex = -1;
    keypool.vchPubKey = CPubKey();
    {
        LOCK(cs_KeyStore);

        bool fReturningInternal = fRequestedInternal;
        fReturningInternal &= (IsHDEnabled() && m_storage.CanSupportFeature(FEATURE_HD_SPLIT)) || m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS);
        bool use_split_keypool = set_pre_split_keypool.empty();
        std::set<int64_t>& setKeyPool = use_split_keypool ? (fReturningInternal ? setInternalKeyPool : setExternalKeyPool) : set_pre_split_keypool;

        // Get the oldest key
        if (setKeyPool.empty()) {
            return false;
        }

        WalletBatch batch(m_storage.GetDatabase());

        auto it = setKeyPool.begin();
        nIndex = *it;
        setKeyPool.erase(it);
        if (!batch.ReadPool(nIndex, keypool)) {
            throw std::runtime_error(std::string(__func__) + ": read failed");
        }
        CPubKey pk;
        if (!GetPubKey(keypool.vchPubKey.GetID(), pk)) {
            throw std::runtime_error(std::string(__func__) + ": unknown key in key pool");
        }
        // If the key was pre-split keypool, we don't care about what type it is
        if (use_split_keypool && keypool.fInternal != fReturningInternal) {
            throw std::runtime_error(std::string(__func__) + ": keypool entry misclassified");
        }
        if (!keypool.vchPubKey.IsValid()) {
            throw std::runtime_error(std::string(__func__) + ": keypool entry invalid");
        }

        assert(m_index_to_reserved_key.count(nIndex) == 0);
        m_index_to_reserved_key[nIndex] = keypool.vchPubKey.GetID();
        m_pool_key_to_index.erase(keypool.vchPubKey.GetID());
        WalletLogPrintf("keypool reserve %d\n", nIndex);
    }
    NotifyCanGetAddressesChanged();
    return true;
}